

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportInvalidTestSuiteType
               (char *test_suite_name,CodeLocation *code_location)

{
  Message *file;
  ostream *this;
  ostream *this_00;
  ostream *poVar1;
  Message errors;
  char (*in_stack_ffffffffffffff18) [68];
  Message *in_stack_ffffffffffffff20;
  Message *in_stack_ffffffffffffff50;
  int line;
  string local_68 [4];
  GTestLogSeverity in_stack_ffffffffffffff9c;
  GTestLog *in_stack_ffffffffffffffa0;
  string local_48 [28];
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  undefined1 local_18 [24];
  
  line = (int)((ulong)local_18 >> 0x20);
  Message::Message(in_stack_ffffffffffffff50);
  file = Message::operator<<(in_stack_ffffffffffffff20,(char (*) [38])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [3])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [65])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [32])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [13])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [63])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [62])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [62])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [13])in_stack_ffffffffffffff18);
  GTestLog::GTestLog(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(char *)file,line);
  this = GTestLog::GetStream((GTestLog *)&stack0xffffffffffffffd8);
  std::__cxx11::string::c_str();
  FormatFileLocation_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  this_00 = std::operator<<(this,local_48);
  poVar1 = std::operator<<(this_00," ");
  Message::GetString_abi_cxx11_((Message *)this);
  std::operator<<(poVar1,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  GTestLog::~GTestLog((GTestLog *)this_00);
  Message::~Message((Message *)0x18485b1);
  return;
}

Assistant:

void ReportInvalidTestSuiteType(const char* test_suite_name,
                                CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test suite " << test_suite_name << ".\n"
      << "All tests in the same test suite must use the same test fixture\n"
      << "class.  However, in test suite " << test_suite_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test suites.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}